

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cpp
# Opt level: O3

int SearchCut(Situation *situation,int depth,int beta,bool allowNullMove)

{
  undefined1 uVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar5;
  undefined4 uVar7;
  Movement hash_move;
  Movement move;
  bool bVar8;
  int iVar9;
  clock_t cVar10;
  long lVar11;
  uint depth_00;
  Movement *all_movements;
  Movement move_00;
  int move_num;
  Movement move_list [128];
  int local_66c;
  Movement local_668;
  ulong local_658;
  undefined4 local_650;
  int local_64c;
  int local_648;
  int local_644;
  undefined1 local_640 [1552];
  undefined6 uVar4;
  undefined5 uVar6;
  
  local_668.from = '\0';
  local_668.to = '\0';
  local_668.capture = '\0';
  local_668._3_1_ = 0;
  local_668.value = 0;
  local_668.catc = '\0';
  local_668.movec = '\0';
  local_668._10_2_ = 0;
  if (depth < 1) {
    iVar9 = QuiescentSearch(situation,beta + -1,beta);
    return iVar9;
  }
  iVar9 = beta;
  if (step + -10000 < beta) {
    local_658 = (ulong)(uint)depth;
    local_650._0_1_ = '\0';
    local_650._1_1_ = '\0';
    local_650._2_2_ = 0;
    local_648 = beta + -1;
    iVar9 = ReadHashTable(depth,local_648,beta,&local_668);
    if (iVar9 == 0x100000) {
      if ((allowNullMove && 0xfa < situation->value[situation->current_player]) &&
         (bVar8 = BeChecked(situation), !bVar8)) {
        MakeNullMove(situation);
        iVar9 = SearchCut(situation,(int)local_658 + -3,1 - beta,false);
        UnMakeNullMove(situation);
        if ((beta <= -iVar9) &&
           (iVar9 = SearchCut(situation,(int)local_658 + -2,beta,false), beta <= iVar9)) {
          depth_00 = 2;
          if (2 < (uint)local_658) {
            depth_00 = (uint)local_658;
          }
          SaveHashTable(depth_00,beta,'\x02',(Movement)ZEXT812((ulong)0));
          return beta;
        }
      }
      if ((isTimeLimit == false) && (cVar10 = clock(), cVar10 - StartTime < 0x9c41)) {
        local_640[0] = '\0';
        local_640[1] = '\0';
        local_640[2] = '\0';
        local_640[3] = 0;
        local_640._4_4_ = 0;
        local_644 = 0;
        hash_move.to = local_668.to;
        hash_move.from = local_668.from;
        hash_move.capture = local_668.capture;
        hash_move._3_1_ = local_668._3_1_;
        hash_move.value = local_668.value;
        hash_move.catc = local_668.catc;
        hash_move.movec = local_668.movec;
        hash_move._10_2_ = local_668._10_2_;
        all_movements = (Movement *)(local_640 + 8);
        MoveSort(situation,&local_644,all_movements,hash_move,step);
        if (0 < local_644) {
          local_66c = -0x100000;
          local_64c = (int)local_658 + -1;
          lVar11 = 0;
          do {
            uVar1 = all_movements->from;
            uVar2 = all_movements->to;
            uVar3 = all_movements->capture;
            uVar5 = all_movements->field_0x3;
            uVar7 = all_movements->value;
            uVar6 = CONCAT41(uVar7,uVar5);
            uVar4 = CONCAT51(uVar6,uVar3);
            local_668.catc = all_movements->catc;
            local_668.movec = all_movements->movec;
            local_668._10_2_ = *(undefined2 *)&all_movements->field_0xa;
            local_668.from = uVar1;
            local_668.to = uVar2;
            local_668._2_6_ = uVar4;
            if (uVar1 != '\0' || uVar2 != '\0') {
              bVar8 = MakeAMove(situation,&local_668,false);
              if (bVar8) {
                iVar9 = step + -10000;
              }
              else {
                iVar9 = SearchCut(situation,local_64c,1 - beta,true);
                iVar9 = -iVar9;
              }
              UnMakeAMove(situation);
              if (local_66c < iVar9) {
                if (beta <= iVar9) {
                  iVar9 = (int)local_658;
                  SetBestMove(&local_668,step,iVar9);
                  move.to = local_668.to;
                  move.from = local_668.from;
                  move.capture = local_668.capture;
                  move._3_1_ = local_668._3_1_;
                  move.value = local_668.value;
                  move.catc = local_668.catc;
                  move.movec = local_668.movec;
                  move._10_2_ = local_668._10_2_;
                  SaveHashTable(iVar9,beta,'\x02',move);
                  return beta;
                }
                local_640[1] = local_668.to;
                local_640[0] = local_668.from;
                local_640[2] = local_668.capture;
                local_640[3] = local_668._3_1_;
                local_640._4_4_ = local_668.value;
                local_650._0_1_ = local_668.catc;
                local_650._1_1_ = local_668.movec;
                local_650._2_2_ = local_668._10_2_;
                local_66c = iVar9;
              }
            }
            lVar11 = lVar11 + 1;
            all_movements = all_movements + 1;
          } while (lVar11 < local_644);
        }
        iVar9 = local_648;
        move_00.catc = (UINT8)local_650;
        move_00.movec = local_650._1_1_;
        move_00._10_2_ = local_650._2_2_;
        move_00.from = local_640[0];
        move_00.to = local_640[1];
        move_00.capture = local_640[2];
        move_00._3_1_ = local_640[3];
        move_00.value = local_640._4_4_;
        SaveHashTable((int)local_658,local_648,'\x01',move_00);
      }
      else {
        isTimeLimit = true;
        iVar9 = 0x100000;
      }
    }
  }
  return iVar9;
}

Assistant:

int SearchCut(Situation& situation, int depth, int beta, bool allowNullMove = false){
    int value;                      // 下一着法的分值
    int best;                       // 所有着法中的最佳分值
    Movement move_list[128];        // 当前所有着法
    Movement move;                  // 当前着法
    Movement good_move;             // 当前局面最佳着法
    move = good_move = NONE_MOVE;
    best = -NONE_VALUE;

    // 到达搜索深度
    if(depth <= 0){
        // 静态搜索评估
        return QuiescentSearch(situation, beta - 1, beta);
    }

    if(step - MAX_VALUE >= beta)
        return beta;

    // 置换表裁剪
    value = ReadHashTable(depth, beta - 1, beta, move);
    if(value != NONE_VALUE){
        return value;
    }

    // 空着裁剪(带检验)
    if(!BanNullMove(situation) && allowNullMove && !BeChecked(situation)){
        MakeNullMove(situation);
        value = -SearchCut(situation, depth - 1 - NULL_REDUCTION, 1 - beta);
        UnMakeNullMove(situation);

        if(value >= beta && SearchCut(situation, depth - NULL_REDUCTION, beta) >= beta){
            SaveHashTable(max(depth, NULL_REDUCTION), beta, hashBETA, NONE_MOVE);
            return beta;
        }
    }

    // 时间检测，避免超限
    if(isTimeLimit || clock() - StartTime > MAX_TIME){
        isTimeLimit = 1;
        return NONE_VALUE;
    }

    int move_num = 0;       // 着法数量
    // 生成着法
    MoveSort(situation, move_num, move_list, move, step);
    for(int i = 0; i < move_num; i++){
        move = move_list[i];
        if(move.from == 0 && move.to == 0) continue;
        // 下子
        if(MakeAMove(situation, move)){
            value = -MAX_VALUE + step;
        }
        else{
            value = -SearchCut(situation, depth - 1, 1 - beta, true);
        }
        // 回溯
        UnMakeAMove(situation);

        if(value > best){
            best = value;           // 更新最佳分数
            good_move = move;       // 更新最佳着法
            if(value >= beta){
                // 此着法是好着法，记录进历史表和杀手表
                SetBestMove(move, step, depth);
                SaveHashTable(depth, beta, hashBETA, move);
                return beta;
            }
        }
    }

    SaveHashTable(depth, beta - 1, hashALPHA, good_move);
    return beta - 1;
}